

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numeric.h
# Opt level: O2

iter_type __thiscall
booster::locale::util::base_num_format<char>::do_real_put<double>
          (base_num_format<char> *this,iter_type out,ios_base *ios,char_type fill,double val)

{
  iter_type iVar1;
  ios_info *this_00;
  uint64_t uVar2;
  uint uVar3;
  bool bVar4;
  iter_type iVar5;
  iter_type out_00;
  undefined1 auVar6 [12];
  sstream_type ss;
  char c;
  locale local_1b0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_1a8 [11];
  
  iVar5._M_sbuf = out._M_sbuf;
  uVar3 = out._8_4_;
  this_00 = ios_info::get(ios);
  uVar2 = ios_info::display_flags(this_00);
  switch(uVar2) {
  case 0:
    std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
    std::locale::classic();
    std::ios::imbue(&local_1b0);
    std::locale::~locale(&local_1b0);
    *(undefined4 *)
     ((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18) + 8) =
         *(undefined4 *)(ios + 0x18);
    *(undefined8 *)
     ((long)&local_1a8[0]._M_string_length + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18)) =
         *(undefined8 *)(ios + 8);
    *(undefined8 *)((long)&local_1a8[0].field_2 + *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18))
         = *(undefined8 *)(ios + 0x10);
    auVar6 = std::num_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::do_put
                       (val,this,iVar5._M_sbuf,uVar3 & 0xff,
                        (undefined1 *)
                        ((long)&local_1a8[0]._M_dataplus._M_p +
                        *(long *)(local_1a8[0]._M_dataplus._M_p + -0x18)),(int)fill);
    *(undefined8 *)(ios + 0x10) = 0;
    std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
    goto LAB_001a3399;
  default:
    iVar5 = (iter_type)
            std::num_put<char,std::ostreambuf_iterator<char,std::char_traits<char>>>::do_put
                      (val,this,iVar5._M_sbuf,uVar3 & 0xff,ios,(int)fill);
    return iVar5;
  case 2:
    uVar2 = ios_info::currency_flags(this_00);
    if (uVar2 == 0) {
      bVar4 = false;
    }
    else {
      uVar2 = ios_info::currency_flags(this_00);
      bVar4 = uVar2 != 0x40;
    }
    iVar5 = (iter_type)
            (**(code **)(*(long *)this + 0x50))
                      (this,bVar4,iVar5._M_sbuf,uVar3 & 0xff,ios,(int)fill,(longdouble)val);
    return iVar5;
  case 4:
    c = 'x';
    break;
  case 5:
    c = 'X';
    break;
  case 6:
    c = 'c';
    break;
  case 7:
    ios_info::date_time_pattern<char>(local_1a8,this_00);
    iVar5._8_4_ = uVar3 & 0xff;
    iVar5._12_4_ = 0;
    iVar5 = format_time(this,iVar5,ios,fill,(long)val,local_1a8);
    auVar6 = iVar5._0_12_;
    std::__cxx11::string::~string((string *)local_1a8);
LAB_001a3399:
    iVar1._12_4_ = 0;
    iVar1._M_sbuf = (streambuf_type *)auVar6._0_8_;
    iVar1._M_failed = (bool)auVar6[8];
    iVar1._9_3_ = auVar6._9_3_;
    return iVar1;
  }
  out_00._8_4_ = uVar3 & 0xff;
  out_00._M_sbuf = iVar5._M_sbuf;
  out_00._12_4_ = 0;
  iVar5 = format_time(this,out_00,ios,fill,(long)val,c);
  return iVar5;
}

Assistant:

iter_type do_real_put (iter_type out, std::ios_base &ios, char_type fill, ValueType val) const
    {
        typedef std::num_put<char_type> super;

        ios_info &info=ios_info::get(ios);

        switch(info.display_flags()) {
        case flags::posix:
            {
                typedef std::basic_ostringstream<char_type> sstream_type;
                sstream_type ss;
                ss.imbue(std::locale::classic());
                ss.flags(ios.flags());
                ss.precision(ios.precision());
                ss.width(ios.width());
                iter_type ret_ptr = super::do_put(out,ss,fill,val);
                ios.width(0);
                return ret_ptr;
            }
        case flags::date:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'x');
        case flags::time:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'X');
        case flags::datetime:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),'c');
        case flags::strftime:
            return format_time(out,ios,fill,static_cast<std::time_t>(val),info.date_time_pattern<char_type>());
        case flags::currency:
            {
                bool nat =  info.currency_flags()==flags::currency_default 
                            || info.currency_flags() == flags::currency_national;
                bool intl = !nat;
                return do_format_currency(intl,out,ios,fill,static_cast<long double>(val));
            }

        case flags::number:
        case flags::percent:
        case flags::spellout:
        case flags::ordinal:
        default:
            return super::do_put(out,ios,fill,val);
        }
    }